

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampTexParameterIErrors.cpp
# Opt level: O2

void __thiscall
glcts::TextureBorderClampTexParameterIErrorsTest::VerifyGLTexParameterIivMultipleAcceptedErrors
          (TextureBorderClampTexParameterIErrorsTest *this,GLenum target,GLenum pname,GLint params,
          GLenum expected_error1,GLenum expected_error2)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  GLint local_1e4;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  local_1e4 = params;
  iVar1 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1340))(target,pname,&local_1e4);
  local_1c0.m_value = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (local_1c0.m_value != expected_error2 && local_1c0.m_value != expected_error1) {
    this->m_test_passed = '\0';
    local_1b0._0_8_ =
         ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"glTexParameterIivEXT() failed:[");
    std::operator<<((ostream *)this_00,"target:");
    pcVar2 = TextureBorderClampBase::getTexTargetString(&this->super_TextureBorderClampBase,target);
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00,", pname:");
    pcVar2 = TextureBorderClampBase::getPNameString(&this->super_TextureBorderClampBase,pname);
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00,"] reported error code:[");
    local_1c0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,"] expected error code:[");
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = expected_error1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,"] or error code [");
    local_1e0.m_getName = glu::getErrorName;
    local_1e0.m_value = expected_error2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,"]\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return;
}

Assistant:

void TextureBorderClampTexParameterIErrorsTest::VerifyGLTexParameterIivMultipleAcceptedErrors(
	glw::GLenum target, glw::GLenum pname, glw::GLint params, glw::GLenum expected_error1, glw::GLenum expected_error2)
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	gl.texParameterIiv(target, pname, &params);

	error_code = gl.getError();
	if (expected_error1 != error_code && expected_error2 != error_code)
	{
		m_test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameterIivEXT() failed:["
						   << "target:" << getTexTargetString(target) << ", pname:" << getPNameString(pname)
						   << "] reported error code:[" << glu::getErrorStr(error_code) << "] expected error code:["
						   << glu::getErrorStr(expected_error1) << "] or error code ["
						   << glu::getErrorStr(expected_error2) << "]\n"
						   << tcu::TestLog::EndMessage;
	}
}